

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O2

shared_ptr<cppcms::impl::cgi::http> __thiscall cppcms::impl::cgi::http::self(http *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<cppcms::impl::cgi::http> sVar1;
  __shared_ptr<cppcms::impl::cgi::connection,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<cppcms::impl::cgi::connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::impl::cgi::connection,void>
            (local_20,(__weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2> *)
                      (in_RSI + 8));
  std::static_pointer_cast<cppcms::impl::cgi::http,cppcms::impl::cgi::connection>
            ((shared_ptr<cppcms::impl::cgi::connection> *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  sVar1.super___shared_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<cppcms::impl::cgi::http>)
         sVar1.super___shared_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

booster::shared_ptr<http> self()
		{
			return booster::static_pointer_cast<http>(shared_from_this());
		}